

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_internal.cc
# Opt level: O2

void absl::cord_internal::LogFatalNodeType(CordRep *rep)

{
  AlphaNum *in_RCX;
  string local_a0;
  AlphaNum local_80;
  string_view local_50 [3];
  
  local_50[0] = NullSafeStringView("Unexpected node type: ");
  AlphaNum::AlphaNum(&local_80,(uint)rep->tag);
  StrCat_abi_cxx11_(&local_a0,(absl *)local_50,&local_80,in_RCX);
  (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
            (3,
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O2/_deps/absl-src/absl/strings/internal/cord_internal.cc"
             ,0x24,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O2/_deps/absl-src/absl/strings/internal/cord_internal.cc"
                ,0x24,"void absl::cord_internal::LogFatalNodeType(CordRep *)");
}

Assistant:

void LogFatalNodeType(CordRep* rep) {
  ABSL_INTERNAL_LOG(FATAL, absl::StrCat("Unexpected node type: ",
                                        static_cast<int>(rep->tag)));
}